

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int mem_av_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t dst;
  bitmap_t bm1;
  uint uVar1;
  in_edge_t_conflict peVar2;
  
  dst = gen_ctx->temp_bitmap;
  bitmap_copy(dst,bb->in);
  peVar2 = (bb->in_edges).head;
  bitmap_copy(bb->in,peVar2->src->out);
  while( true ) {
    peVar2 = (peVar2->in_link).next;
    bm1 = bb->in;
    if (peVar2 == (in_edge_t)0x0) break;
    bitmap_and(bm1,bm1,peVar2->src->out);
  }
  uVar1 = bitmap_equal_p(bm1,dst);
  return uVar1 ^ 1;
}

Assistant:

static int mem_av_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e, head;
  bitmap_t prev_mem_av_in = temp_bitmap;

  bitmap_copy (prev_mem_av_in, bb->mem_av_in);
  head = DLIST_HEAD (in_edge_t, bb->in_edges);
  bitmap_copy (bb->mem_av_in, head->src->mem_av_out);
  for (e = DLIST_NEXT (in_edge_t, head); e != NULL; e = DLIST_NEXT (in_edge_t, e))
    bitmap_and (bb->mem_av_in, bb->mem_av_in, e->src->mem_av_out); /* mem_av_in &= mem_av_out */
  return !bitmap_equal_p (bb->mem_av_in, prev_mem_av_in);
}